

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O0

anon_unknown_0 * __thiscall
core::image::anon_unknown_0::debug_print<float>(anon_unknown_0 *this,float *value,string *extra)

{
  string local_58 [55];
  allocator local_21;
  string *local_20;
  string *extra_local;
  float *value_local;
  
  local_20 = extra;
  extra_local = (string *)value;
  value_local = (float *)this;
  if (0.0 < *value || *value == 0.0) {
    util::string::get<float>(local_58,value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"<not set>",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return this;
}

Assistant:

std::string
    debug_print (T const& value, std::string extra = "")
    {
        if (value < T(0))
            return "<not set>";
        else
            return util::string::get(value) + extra;
    }